

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

char * resole_appdir_path(char *root_env_file_path)

{
  char *pcVar1;
  
  pcVar1 = getenv("APPDIR");
  if (pcVar1 != (char *)0x0) {
    return pcVar1;
  }
  if (root_env_file_path != (char *)0x0) {
    pcVar1 = strrchr(root_env_file_path,0x2f);
    pcVar1 = strndup(root_env_file_path,(long)pcVar1 - (long)root_env_file_path);
    return pcVar1;
  }
  fwrite("APPRUN ERROR: Could not resolve APPDIR\n",0x27,1,_stderr);
  exit(1);
}

Assistant:

char *resole_appdir_path(const char *root_env_file_path) {
    char *appdir = getenv("APPDIR");
    if (appdir == NULL) {
        if (root_env_file_path != NULL) {
            char *idx = strrchr(root_env_file_path, '/');
            appdir = strndup(root_env_file_path, idx - root_env_file_path);
        } else {
            die("Could not resolve APPDIR\n");
        }
    }
    return appdir;
}